

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O3

void google::protobuf::internal::WireFormat::SerializeWithCachedSizes
               (Message *message,int size,CodedOutputStream *output)

{
  int iVar1;
  int64_t iVar2;
  uint8_t *ptr;
  Nonnull<const_char_*> failure_msg;
  int iVar3;
  LogMessage local_30;
  
  iVar2 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
  iVar3 = ((int)iVar2 - (int)output->start_count_) + size;
  ptr = _InternalSerialize(message,output->cur_,&output->impl_);
  output->cur_ = ptr;
  iVar2 = io::EpsCopyOutputStream::ByteCount(&output->impl_,ptr);
  iVar1 = (int)iVar2 - (int)output->start_count_;
  if (iVar3 == iVar1) {
    return;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)iVar1,(long)iVar3,"output->ByteCount() == expected_endpoint");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.h"
             ,0x73,failure_msg);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_30,
             (char (*) [150])
             ": Protocol message serialized to a size different from what was originally expected.  Perhaps it was modified by another thread during serialization?"
            );
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

static void SerializeWithCachedSizes(const Message& message, int size,
                                       io::CodedOutputStream* output) {
    int expected_endpoint = output->ByteCount() + size;
    output->SetCur(
        _InternalSerialize(message, output->Cur(), output->EpsCopy()));
    ABSL_CHECK_EQ(output->ByteCount(), expected_endpoint)
        << ": Protocol message serialized to a size different from what was "
           "originally expected.  Perhaps it was modified by another thread "
           "during serialization?";
  }